

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O3

void QVariantAnimation::registerInterpolator(Interpolator func,int interpolationType)

{
  QBasicMutex copy;
  Type *this;
  
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
                       *)func);
  if (this != (Type *)0x0) {
    if ((AtomicType)registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal(&registeredInterpolatorsMutex);
    }
    if ((this->d).size <= (long)interpolationType) {
      QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::resize
                (this,(long)(interpolationType + 1));
    }
    QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::replace
              (this,(long)interpolationType,(parameter_type)func);
    copy = registeredInterpolatorsMutex;
    LOCK();
    registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex
                (&registeredInterpolatorsMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
      return;
    }
  }
  return;
}

Assistant:

void QVariantAnimation::registerInterpolator(QVariantAnimation::Interpolator func, int interpolationType)
{
    // will override any existing interpolators
    QInterpolatorVector *interpolators = registeredInterpolators();
    // When built on solaris with GCC, the destructors can be called
    // in such an order that we get here with interpolators == NULL,
    // to continue causes the app to crash on exit with a SEGV
    if (interpolators) {
        const auto locker = qt_scoped_lock(registeredInterpolatorsMutex);
        if (interpolationType >= interpolators->size())
            interpolators->resize(interpolationType + 1);
        interpolators->replace(interpolationType, func);
    }
}